

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_parse.c
# Opt level: O1

int mpt_node_parse(mpt_node *conf,FILE *file,char *format,char *limits,mpt_logger *log)

{
  mpt_node *pmVar1;
  int iVar2;
  char *name;
  mpt_parser_context parse;
  mpt_node root;
  
  parse.src.line = 1;
  parse.name.sect = 0xff;
  parse.name.opt = 0xff;
  parse.valid = 0;
  parse.prev = '\0';
  parse.curr = '\0';
  parse.src.getc = (_func_int_void_ptr *)0x0;
  parse.src.arg = (void *)0x0;
  if (file == (FILE *)0x0) {
    iVar2 = -1;
    if (log != (mpt_logger *)0x0) {
      mpt_log(log,"mpt_node_parse",3,"%s","bad file argument");
    }
  }
  else {
    name = "ns";
    if (limits != (char *)0x0) {
      name = limits;
    }
    parse.src.getc = mpt_getchar_stdio;
    parse.src.arg = file;
    iVar2 = mpt_parse_accept(&parse.name,name);
    if (iVar2 < 0) {
      iVar2 = -1;
      if (log != (mpt_logger *)0x0) {
        mpt_log(log,"mpt_node_parse",3,"%s: %s","bad name limits",name);
      }
    }
    else {
      pmVar1 = conf->children;
      conf->children = (mpt_node *)0x0;
      iVar2 = mpt_parse_node(conf,&parse,format);
      if (iVar2 < 0) {
        conf->children = pmVar1;
        if (log != (mpt_logger *)0x0) {
          mpt_log(log,"mpt_node_parse",3,"%s (%x): %s %u","parse error",(ulong)parse._24_8_ >> 0x38,
                  "line",parse.src.line & 0xffffffff);
        }
      }
      else {
        root.prev = (mpt_node *)0x0;
        root.parent = (mpt_node *)0x0;
        root._meta = (mpt_metatype *)0x0;
        root.next = (mpt_node *)0x0;
        root.ident._base = (char *)0x0;
        root.ident._len = 0;
        root.ident._charset = '\0';
        root.ident._max = '\f';
        root.ident._val[0] = '\0';
        root.ident._val[1] = '\0';
        root.ident._val[2] = '\0';
        root.ident._val[3] = '\0';
        root.children = pmVar1;
        mpt_node_clear(&root);
      }
    }
  }
  return iVar2;
}

Assistant:

extern int mpt_node_parse(MPT_STRUCT(node) *conf, FILE *file, const char *format, const char *limits, MPT_INTERFACE(logger) *log)
{
	MPT_STRUCT(parser_context) parse = MPT_PARSER_INIT;
	MPT_STRUCT(node) *old;
	int res;
	
	if (!file) {
		if (log) mpt_log(log, __func__, MPT_LOG(Error), "%s", MPT_tr("bad file argument"));
		return MPT_ERROR(BadArgument);
	}
	if (!limits) {
		limits = "ns";
	}
	parse.src.getc = (int (*)()) mpt_getchar_stdio;
	parse.src.arg  = file;
	if ((res = mpt_parse_accept(&parse.name, limits)) < 0) {
		if (log) mpt_log(log, __func__, MPT_LOG(Error), "%s: %s", MPT_tr("bad name limits"), limits);
		return MPT_ERROR(BadArgument);
	}
	
	/* clear children to trigger non-merge read */
	old = conf->children;
	conf->children = 0;
	
	res = mpt_parse_node(conf, &parse, format);
	/* replace tree content */
	if (res >= 0) {
		MPT_STRUCT(node) root = MPT_NODE_INIT;
		root.children = old;
		mpt_node_clear(&root);
		
		return res;
	}
	/* restore old subtree base */
	conf->children = old;
	
	if (log) {
		mpt_log(log, __func__, MPT_LOG(Error), "%s (%x): %s %u",
		        MPT_tr("parse error"), parse.curr, MPT_tr("line"), (int) parse.src.line);
	}
	return res;
}